

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O0

void __thiscall tripwire_basic_Test::~tripwire_basic_Test(tripwire_basic_Test *this)

{
  tripwire_basic_Test *this_local;
  
  ~tripwire_basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(tripwire, basic)
{
    auto line = make_tripline();
    auto trig = std::make_shared<TripWireTrigger>(line);
    TripWireDetector detect(line);

    EXPECT_FALSE(detect.isTripped());
    trig = nullptr;
    EXPECT_TRUE(detect.isTripped());
}